

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O3

void __thiscall Assimp::FBX::BlendShapeChannel::~BlendShapeChannel(BlendShapeChannel *this)

{
  ~BlendShapeChannel(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

BlendShapeChannel::~BlendShapeChannel()
{

}